

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_inverse_field(secp256k1_fe *out,secp256k1_fe *x,int var)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  int iVar60;
  undefined4 uVar61;
  uint uVar62;
  uint extraout_EAX;
  uint32_t uVar63;
  int extraout_EDX;
  long *extraout_RDX;
  long lVar64;
  secp256k1_fe *r;
  secp256k1_fe *a;
  long lVar65;
  ulong uVar66;
  secp256k1_fe *r_00;
  secp256k1_fe *size;
  secp256k1_fe *psVar67;
  uchar *__s;
  ulong uVar68;
  ulong uVar69;
  size_t count;
  secp256k1_fe *psVar70;
  code *pcVar71;
  code *pcVar72;
  uint extraout_XMM0_Da;
  uint uVar73;
  uint extraout_XMM0_Db;
  uint uVar74;
  uint extraout_XMM0_Dc;
  uint uVar75;
  uint extraout_XMM0_Dd;
  uint uVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  ulong uStack_1278;
  secp256k1_fe *psStack_1270;
  uchar auStack_1268 [4232];
  secp256k1_fe *psStack_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  secp256k1_fe *psStack_1c8;
  code *pcStack_1c0;
  code *pcStack_1b8;
  undefined1 auStack_1b0 [32];
  undefined1 auStack_190 [40];
  long lStack_168;
  long lStack_160;
  long lStack_158;
  secp256k1_fe *psStack_150;
  secp256k1_fe *psStack_148;
  code *pcStack_140;
  undefined8 local_138;
  ulong local_130;
  undefined1 local_128 [16];
  ulong local_118;
  undefined8 local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  secp256k1_fe local_d8;
  code *local_b0;
  secp256k1_fe *local_a8;
  undefined8 local_a0;
  secp256k1_fe *local_98;
  ulong local_90;
  secp256k1_fe local_88;
  secp256k1_fe local_58;
  
  pcVar71 = secp256k1_fe_impl_inv_var;
  if (var == 0) {
    pcVar71 = secp256k1_fe_impl_inv;
  }
  pcStack_140 = (code *)0x16105c;
  (*pcVar71)(&local_d8);
  if (out != (secp256k1_fe *)0x0) {
    out->n[4] = local_d8.n[4];
    out->n[2] = local_d8.n[2];
    out->n[3] = local_d8.n[3];
    out->n[0] = local_d8.n[0];
    out->n[1] = local_d8.n[1];
  }
  local_88.n[4] = x->n[4];
  local_88.n[0] = x->n[0];
  local_88.n[1] = x->n[1];
  local_88.n[2] = x->n[2];
  local_88.n[3] = x->n[3];
  pcStack_140 = (code *)0x1610a7;
  iVar60 = secp256k1_fe_impl_normalizes_to_zero_var(&local_88);
  if (iVar60 != 0) {
    pcStack_140 = (code *)0x1610b5;
    iVar60 = secp256k1_fe_impl_normalizes_to_zero(&local_d8);
    if (iVar60 != 0) {
      return;
    }
    pcStack_140 = (code *)0x1610c2;
    test_inverse_field_cold_1();
  }
  uVar68 = x->n[0];
  local_e8 = x->n[1];
  local_108 = x->n[2];
  local_100 = x->n[3];
  local_118 = local_d8.n[3];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_d8.n[3];
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar68;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_d8.n[2];
  auVar32._8_8_ = 0;
  auVar32._0_8_ = local_e8;
  r = (secp256k1_fe *)x->n[4];
  local_f8 = local_d8.n[0];
  local_e0 = local_d8.n[1];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_d8.n[1];
  auVar33._8_8_ = 0;
  auVar33._0_8_ = local_108;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_d8.n[0];
  auVar34._8_8_ = 0;
  auVar34._0_8_ = local_100;
  local_f0 = local_d8.n[4];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_d8.n[4];
  auVar35._8_8_ = 0;
  auVar35._0_8_ = r;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = SUB168(auVar5 * auVar35,0);
  auVar1 = auVar2 * auVar32 + auVar1 * auVar31 + auVar3 * auVar33 + auVar4 * auVar34 +
           auVar6 * ZEXT816(0x1000003d10);
  local_90 = auVar1._0_8_;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_d8.n[4];
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar68;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_d8.n[3];
  auVar37._8_8_ = 0;
  auVar37._0_8_ = local_e8;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_d8.n[2];
  auVar38._8_8_ = 0;
  auVar38._0_8_ = local_108;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_d8.n[1];
  auVar39._8_8_ = 0;
  auVar39._0_8_ = local_100;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_d8.n[0];
  auVar40._8_8_ = 0;
  auVar40._0_8_ = r;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = SUB168(auVar5 * auVar35,8);
  auVar1 = auVar12 * ZEXT816(0x1000003d10000) +
           auVar11 * auVar40 + auVar10 * auVar39 + auVar9 * auVar38 + auVar8 * auVar37 +
           auVar7 * auVar36 + (auVar1 >> 0x34);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_d8.n[0];
  auVar41._8_8_ = 0;
  auVar41._0_8_ = uVar68;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_d8.n[4];
  auVar42._8_8_ = 0;
  auVar42._0_8_ = local_e8;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = local_d8.n[3];
  auVar43._8_8_ = 0;
  auVar43._0_8_ = local_108;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_d8.n[2];
  auVar44._8_8_ = 0;
  auVar44._0_8_ = local_100;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_d8.n[1];
  auVar45._8_8_ = 0;
  auVar45._0_8_ = r;
  auVar2 = auVar17 * auVar45 + auVar16 * auVar44 + auVar15 * auVar43 + auVar14 * auVar42 +
           (auVar1 >> 0x34);
  auVar3 = auVar2 >> 0x34;
  local_110 = auVar3._8_8_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = (auVar2._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar1._6_2_ & 0xf);
  auVar2 = auVar18 * ZEXT816(0x1000003d1) + auVar13 * auVar41;
  local_130 = auVar2._0_8_;
  uVar66 = auVar2._8_8_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = local_d8.n[1];
  auVar46._8_8_ = 0;
  auVar46._0_8_ = uVar68;
  auVar19 = auVar19 * auVar46;
  local_a0 = auVar19._0_8_;
  auVar56._8_8_ = uVar66 >> 0x34;
  auVar56._0_8_ = uVar66 * 0x1000 | local_130 >> 0x34;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = local_d8.n[0];
  auVar47._8_8_ = 0;
  auVar47._0_8_ = local_e8;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = local_d8.n[4];
  auVar48._8_8_ = 0;
  auVar48._0_8_ = local_108;
  local_130 = local_130 & 0xfffffffffffff;
  local_138 = auVar19._8_8_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = local_d8.n[3];
  auVar49._8_8_ = 0;
  auVar49._0_8_ = local_100;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = local_d8.n[2];
  auVar50._8_8_ = 0;
  auVar50._0_8_ = r;
  auVar3 = auVar3 + auVar21 * auVar48 + auVar23 * auVar50 + auVar22 * auVar49;
  uVar69 = auVar3._0_8_;
  uVar66 = auVar3._8_8_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar69 & 0xfffffffffffff;
  auVar56 = auVar24 * ZEXT816(0x1000003d10) + auVar20 * auVar47 + auVar19 + auVar56;
  uVar69 = uVar66 * 0x1000 | uVar69 >> 0x34;
  psVar70 = (secp256k1_fe *)(uVar66 >> 0x34);
  auVar57._8_8_ = psVar70;
  auVar57._0_8_ = uVar69;
  local_128._8_8_ = 0;
  local_128._0_8_ = local_d8.n[2];
  auVar51._8_8_ = 0;
  auVar51._0_8_ = uVar68;
  local_128 = local_128 * auVar51;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = local_d8.n[1];
  auVar52._8_8_ = 0;
  auVar52._0_8_ = local_e8;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = local_d8.n[0];
  auVar53._8_8_ = 0;
  auVar53._0_8_ = local_108;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = local_d8.n[4];
  auVar54._8_8_ = 0;
  auVar54._0_8_ = local_100;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = local_d8.n[3];
  auVar55._8_8_ = 0;
  auVar55._0_8_ = r;
  auVar57 = auVar28 * auVar55 + auVar27 * auVar54 + auVar57;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = auVar57._0_8_;
  auVar2 = auVar29 * ZEXT816(0x1000003d10) + auVar26 * auVar53 + auVar25 * auVar52 + local_128 +
           (auVar56 >> 0x34);
  auVar3 = auVar2 >> 0x34;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = auVar3._0_8_;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = auVar57._8_8_;
  auVar58._8_8_ = auVar3._8_8_;
  auVar58._0_8_ = local_90 & 0xfffffffffffff;
  auVar59 = auVar30 * ZEXT816(0x1000003d10000) + auVar58 + auVar59;
  uVar68 = auVar59._0_8_;
  local_88.n[0] = local_130 + 0xffffefffffc2e;
  r_00 = &local_88;
  pcVar72 = (code *)((auVar56._0_8_ & 0xfffffffffffff) + 0xfffffffffffff);
  local_88.n[2] = (auVar2._0_8_ & 0xfffffffffffff) + 0xfffffffffffff;
  local_88.n[3] = (uVar68 & 0xfffffffffffff) + 0xfffffffffffff;
  a = (secp256k1_fe *)
      ((auVar1._0_8_ & 0xffffffffffff) + 0xffffffffffff + (auVar59._8_8_ << 0xc | uVar68 >> 0x34));
  pcStack_140 = (code *)0x1614e9;
  local_b0 = pcVar71;
  local_a8 = x;
  local_98 = r;
  local_88.n[1] = (uint64_t)pcVar72;
  local_88.n[4] = (uint64_t)a;
  iVar60 = secp256k1_fe_impl_normalizes_to_zero(r_00);
  if (iVar60 == 0) {
    pcStack_140 = (code *)0x1615f6;
    test_inverse_field_cold_3();
  }
  else {
    local_58.n[0] = local_a8->n[0] + 0xffffefffffc2e;
    local_58.n[1] = local_a8->n[1] + 0xfffffffffffff;
    local_58.n[2] = local_a8->n[2] + 0xfffffffffffff;
    local_58.n[3] = local_a8->n[3] + 0xfffffffffffff;
    local_58.n[4] = local_a8->n[4] + 0xffffffffffff;
    pcStack_140 = (code *)0x161547;
    iVar60 = secp256k1_fe_impl_normalizes_to_zero_var(&local_58);
    pcVar72 = local_b0;
    if (iVar60 != 0) {
      return;
    }
    psVar70 = &local_58;
    pcStack_140 = (code *)0x161568;
    (*local_b0)(psVar70,psVar70);
    r = &local_d8;
    local_d8.n[0] = local_d8.n[0] + 0xffffefffffc2e;
    local_d8.n[1] = local_d8.n[1] + 0xfffffffffffff;
    local_d8.n[2] = local_d8.n[2] + 0xfffffffffffff;
    local_d8.n[3] = local_d8.n[3] + 0xfffffffffffff;
    local_d8.n[4] = local_d8.n[4] + 0xffffffffffff;
    pcStack_140 = (code *)0x16159c;
    a = r;
    (*pcVar72)(r);
    local_d8.n[0] = local_d8.n[0] + local_58.n[0] + 1;
    local_d8.n[1] = local_d8.n[1] + local_58.n[1];
    local_d8.n[2] = local_d8.n[2] + local_58.n[2];
    local_d8.n[3] = local_d8.n[3] + local_58.n[3];
    local_d8.n[4] = local_d8.n[4] + local_58.n[4];
    pcStack_140 = (code *)0x1615db;
    r_00 = r;
    iVar60 = secp256k1_fe_impl_normalizes_to_zero_var(r);
    if (iVar60 != 0) {
      return;
    }
  }
  pcStack_140 = test_inverse_scalar;
  test_inverse_field_cold_2();
  size = (secp256k1_fe *)auStack_1b0;
  psVar67 = (secp256k1_fe *)auStack_1b0;
  pcVar71 = secp256k1_scalar_inverse_var;
  if (extraout_EDX == 0) {
    pcVar71 = secp256k1_scalar_inverse;
  }
  pcStack_1b8 = (code *)0x161624;
  psStack_150 = r;
  psStack_148 = psVar70;
  pcStack_140 = pcVar72;
  uVar61 = (*pcVar71)();
  if (r_00 != (secp256k1_fe *)0x0) {
    r_00->n[2] = CONCAT44(auStack_1b0._20_4_,auStack_1b0._16_4_);
    r_00->n[3] = CONCAT44(auStack_1b0._28_4_,auStack_1b0._24_4_);
    r_00->n[0] = CONCAT44(auStack_1b0._4_4_,auStack_1b0._0_4_);
    r_00->n[1] = CONCAT44(auStack_1b0._12_4_,auStack_1b0._8_4_);
  }
  uVar73 = 0;
  uVar74 = 0;
  uVar75 = 0;
  uVar76 = 0;
  auVar77._0_4_ = -(uint)((int)a->n[2] == 0 && (int)a->n[0] == 0);
  auVar77._4_4_ = -(uint)(*(int *)((long)a->n + 0x14) == 0 && *(int *)((long)a->n + 4) == 0);
  auVar77._8_4_ = -(uint)((int)a->n[3] == 0 && (int)a->n[1] == 0);
  auVar77._12_4_ = -(uint)(*(int *)((long)a->n + 0x1c) == 0 && *(int *)((long)a->n + 0xc) == 0);
  uVar62 = movmskps(uVar61,auVar77);
  uVar62 = uVar62 ^ 0xf;
  if (uVar62 != 0) {
    r_00 = (secp256k1_fe *)(auStack_190 + 0x20);
    pcStack_1b8 = (code *)0x16166f;
    size = r_00;
    secp256k1_scalar_mul
              ((secp256k1_scalar *)r_00,(secp256k1_scalar *)a,(secp256k1_scalar *)auStack_1b0);
    if (((auStack_190._32_8_ != 1 || lStack_168 != 0) || lStack_160 != 0) || lStack_158 != 0) {
      pcStack_1b8 = (code *)0x16175c;
      test_inverse_scalar_cold_1();
      goto LAB_0016175c;
    }
    pcStack_1b8 = (code *)0x16169f;
    iVar60 = secp256k1_scalar_add
                       ((secp256k1_scalar *)auStack_190,(secp256k1_scalar *)a,&scalar_minus_one);
    auVar78._0_4_ = -(uint)(auStack_190._16_4_ == 0 && auStack_190._0_4_ == 0);
    auVar78._4_4_ = -(uint)(auStack_190._20_4_ == 0 && auStack_190._4_4_ == 0);
    auVar78._8_4_ = -(uint)(auStack_190._24_4_ == 0 && auStack_190._8_4_ == 0);
    auVar78._12_4_ = -(uint)(auStack_190._28_4_ == 0 && auStack_190._12_4_ == 0);
    iVar60 = movmskps(iVar60,auVar78);
    if (iVar60 == 0xf) {
      return;
    }
    a = (secp256k1_fe *)auStack_190;
    pcStack_1b8 = (code *)0x1616d0;
    (*pcVar71)(a,a);
    pcStack_1b8 = (code *)0x1616e5;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_1b0,&scalar_minus_one,(secp256k1_scalar *)auStack_1b0);
    pcStack_1b8 = (code *)0x1616ee;
    (*pcVar71)(auStack_1b0,auStack_1b0);
    pcStack_1b8 = (code *)0x161700;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_1b0,(secp256k1_scalar *)auStack_1b0,&secp256k1_scalar_one
              );
    pcStack_1b8 = (code *)0x16170e;
    iVar60 = secp256k1_scalar_add
                       ((secp256k1_scalar *)auStack_1b0,(secp256k1_scalar *)a,
                        (secp256k1_scalar *)auStack_1b0);
    auVar79._0_4_ = -(uint)(auStack_1b0._16_4_ == 0 && auStack_1b0._0_4_ == 0);
    auVar79._4_4_ = -(uint)(auStack_1b0._20_4_ == 0 && auStack_1b0._4_4_ == 0);
    auVar79._8_4_ = -(uint)(auStack_1b0._24_4_ == 0 && auStack_1b0._8_4_ == 0);
    auVar79._12_4_ = -(uint)(auStack_1b0._28_4_ == 0 && auStack_1b0._12_4_ == 0);
    iVar60 = movmskps(iVar60,auVar79);
    if (iVar60 == 0xf) {
      return;
    }
    pcStack_1b8 = (code *)0x161732;
    test_inverse_scalar_cold_2();
    size = psVar67;
    r_00 = (secp256k1_fe *)auStack_1b0;
    uVar62 = extraout_EAX;
    uVar73 = extraout_XMM0_Da;
    uVar74 = extraout_XMM0_Db;
    uVar75 = extraout_XMM0_Dc;
    uVar76 = extraout_XMM0_Dd;
  }
  auVar80._0_4_ = -(uint)((auStack_1b0._16_4_ | auStack_1b0._0_4_) == uVar73);
  auVar80._4_4_ = -(uint)((auStack_1b0._20_4_ | auStack_1b0._4_4_) == uVar74);
  auVar80._8_4_ = -(uint)((auStack_1b0._24_4_ | auStack_1b0._8_4_) == uVar75);
  auVar80._12_4_ = -(uint)((auStack_1b0._28_4_ | auStack_1b0._12_4_) == uVar76);
  iVar60 = movmskps(uVar62,auVar80);
  if (iVar60 == 0xf) {
    return;
  }
LAB_0016175c:
  pcStack_1b8 = test_hsort;
  test_inverse_scalar_cold_3();
  uStack_1d8 = 0xffffffffffff;
  __s = auStack_1268;
  psStack_1e0 = a;
  uStack_1d0 = SUB168(auVar26 * auVar53,0);
  psStack_1c8 = r_00;
  pcStack_1c0 = pcVar71;
  pcStack_1b8 = (code *)uVar69;
  memset(__s,0,0x1081);
  uStack_1278 = 0;
  lVar65 = 0x41;
  psStack_1270 = size;
  secp256k1_hsort(__s,0x41,(size_t)size,test_hsort_cmp,&uStack_1278);
  if (0x3f < uStack_1278) {
    test_hsort_is_sorted(auStack_1268,0x41,(size_t)size);
    if (0 < COUNT) {
      iVar60 = 0;
      do {
        uVar63 = testrand_int(0x41);
        count = (size_t)(int)uVar63;
        testrand_bytes_test(auStack_1268,count * (long)size);
        secp256k1_hsort(auStack_1268,count,(size_t)size,test_hsort_cmp,&uStack_1278);
        test_hsort_is_sorted(auStack_1268,count,(size_t)size);
        iVar60 = iVar60 + 1;
      } while (iVar60 < COUNT);
    }
    return;
  }
  test_hsort_cold_1();
  *extraout_RDX = *extraout_RDX + 1;
  if (extraout_RDX[1] != 0) {
    lVar64 = 0;
    do {
      if (__s[lVar64] != *(uchar *)(lVar65 + lVar64)) {
        return;
      }
      lVar64 = lVar64 + 1;
    } while (extraout_RDX[1] != lVar64);
  }
  return;
}

Assistant:

static void test_inverse_field(secp256k1_fe* out, const secp256k1_fe* x, int var)
{
    secp256k1_fe l, r, t;

    (var ? secp256k1_fe_inv_var : secp256k1_fe_inv)(&l, x) ;   /* l = 1/x */
    if (out) *out = l;
    t = *x;                                                    /* t = x */
    if (secp256k1_fe_normalizes_to_zero_var(&t)) {
        CHECK(secp256k1_fe_normalizes_to_zero(&l));
        return;
    }
    secp256k1_fe_mul(&t, x, &l);                               /* t = x*(1/x) */
    secp256k1_fe_add(&t, &fe_minus_one);                       /* t = x*(1/x)-1 */
    CHECK(secp256k1_fe_normalizes_to_zero(&t));                /* x*(1/x)-1 == 0 */
    r = *x;                                                    /* r = x */
    secp256k1_fe_add(&r, &fe_minus_one);                       /* r = x-1 */
    if (secp256k1_fe_normalizes_to_zero_var(&r)) return;
    (var ? secp256k1_fe_inv_var : secp256k1_fe_inv)(&r, &r);   /* r = 1/(x-1) */
    secp256k1_fe_add(&l, &fe_minus_one);                       /* l = 1/x-1 */
    (var ? secp256k1_fe_inv_var : secp256k1_fe_inv)(&l, &l);   /* l = 1/(1/x-1) */
    secp256k1_fe_add_int(&l, 1);                               /* l = 1/(1/x-1)+1 */
    secp256k1_fe_add(&l, &r);                                  /* l = 1/(1/x-1)+1 + 1/(x-1) */
    CHECK(secp256k1_fe_normalizes_to_zero_var(&l));            /* l == 0 */
}